

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

CopyResult
cmSystemTools::CopySingleFile
          (string *oldname,string *newname,CopyWhen when,CopyInputRecent inputRecent,string *err)

{
  bool bVar1;
  Status SVar2;
  CopyStatus CVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  mode_t perm;
  mode_t local_b4;
  CopyStatus local_b0;
  string local_a0;
  Status local_80;
  string local_78;
  string local_58;
  char *local_38;
  undefined8 local_30;
  
  if ((when == OnlyIfDifferent) &&
     (bVar1 = cmsys::SystemTools::FilesDiffer(oldname,newname), !bVar1)) {
    return Success;
  }
  local_b4 = 0;
  SVar2 = cmsys::SystemTools::GetPermissions(oldname,&local_b4);
  bVar1 = cmsys::SystemTools::SameFile(oldname,newname);
  if (bVar1) {
    return Success;
  }
  CVar3 = cmsys::SystemTools::CloneFileContent(oldname,newname);
  if ((CVar3.super_Status.Kind_ == Success) ||
     (local_b0 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname),
     local_b0.super_Status.Kind_ == Success)) {
    if (SVar2.Kind_ != Success) {
      return Success;
    }
    local_80 = cmsys::SystemTools::SetPermissions(newname,local_b4,false);
    if (local_80.Kind_ == Success) {
      return Success;
    }
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_78,&local_80);
    local_58._M_dataplus._M_p = (pointer)local_78._M_string_length;
    local_58._M_string_length = (size_type)local_78._M_dataplus._M_p;
    local_58.field_2._8_8_ = 9;
    local_38 = " (output)";
    local_30 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_58;
    local_58.field_2._M_allocated_capacity = (size_type)&local_78;
    cmCatViews(&local_a0,views);
    std::__cxx11::string::operator=((string *)err,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return Failure;
    }
  }
  else {
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_58,&local_b0.super_Status);
    std::__cxx11::string::operator=((string *)err,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.Path == DestPath) {
      local_58._M_string_length = (size_type)(err->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)err->_M_string_length;
      local_58.field_2._8_8_ = 9;
      local_38 = " (output)";
    }
    else {
      if (local_b0.Path != SourcePath) {
        return Failure;
      }
      local_58._M_string_length = (size_type)(err->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)err->_M_string_length;
      local_58.field_2._8_8_ = 8;
      local_38 = " (input)";
    }
    local_58.field_2._M_allocated_capacity = 0;
    views_00._M_array = &local_58;
    local_30 = 0;
    views_00._M_len = 2;
    cmCatViews(&local_a0,views_00);
    std::__cxx11::string::operator=((string *)err,(string *)&local_a0);
    local_78.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return Failure;
    }
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  return Failure;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  CopyInputRecent inputRecent, std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::SystemTools::CopyStatus status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
#ifdef _WIN32
    if (inputRecent == CopyInputRecent::Yes) {
      // Windows sometimes locks a file immediately after creation.
      // Retry a few times.
      WindowsFileRetry retry = cmSystemTools::GetWindowsFileRetry();
      while ((status =
                cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname),
              status.Path == cmsys::SystemTools::CopyStatus::SourcePath &&
                status.GetPOSIX() == EACCES && --retry.Count)) {
        cmSystemTools::Delay(retry.Delay);
      }
    } else {
      status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
    }
#else
    static_cast<void>(inputRecent);
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
#endif
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
      switch (status.Path) {
        case cmsys::SystemTools::CopyStatus::SourcePath:
          *err = cmStrCat(*err, " (input)");
          break;
        case cmsys::SystemTools::CopyStatus::DestPath:
          *err = cmStrCat(*err, " (output)");
          break;
        default:
          break;
      }
    }
    return CopyResult::Failure;
  }
  if (perms) {
    perms = SystemTools::SetPermissions(newname, perm);
    if (!perms) {
      if (err) {
        *err = cmStrCat(perms.GetString(), " (output)");
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}